

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::KurtosisState,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>>
               (double *idata,AggregateInputData *aggr_input_data,KurtosisState **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  KurtosisState *pKVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar6 = 0;
      do {
        pKVar3 = states[iVar6];
        pKVar3->n = pKVar3->n + 1;
        dVar11 = idata[iVar6];
        pKVar3->sum = dVar11 + pKVar3->sum;
        pKVar3->sum_sqr = dVar11 * dVar11 + pKVar3->sum_sqr;
        dVar10 = pow(dVar11,3.0);
        pKVar3->sum_cub = dVar10 + pKVar3->sum_cub;
        dVar11 = pow(dVar11,4.0);
        pKVar3->sum_four = dVar11 + pKVar3->sum_four;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_00d3d90e:
        uVar4 = uVar8;
        if (uVar8 < uVar9) {
          do {
            pKVar3 = states[uVar8];
            pKVar3->n = pKVar3->n + 1;
            dVar11 = idata[uVar8];
            pKVar3->sum = dVar11 + pKVar3->sum;
            pKVar3->sum_sqr = dVar11 * dVar11 + pKVar3->sum_sqr;
            dVar10 = pow(dVar11,3.0);
            pKVar3->sum_cub = dVar10 + pKVar3->sum_cub;
            dVar11 = pow(dVar11,4.0);
            pKVar3->sum_four = dVar11 + pKVar3->sum_four;
            uVar8 = uVar8 + 1;
            uVar4 = uVar9;
          } while (uVar9 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00d3d90e;
        uVar4 = uVar9;
        if ((uVar2 != 0) && (uVar4 = uVar8, uVar8 < uVar9)) {
          uVar7 = 0;
          do {
            if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
              pKVar3 = states[uVar8 + uVar7];
              pKVar3->n = pKVar3->n + 1;
              dVar11 = idata[uVar8 + uVar7];
              pKVar3->sum = dVar11 + pKVar3->sum;
              pKVar3->sum_sqr = dVar11 * dVar11 + pKVar3->sum_sqr;
              dVar10 = pow(dVar11,3.0);
              pKVar3->sum_cub = dVar10 + pKVar3->sum_cub;
              dVar11 = pow(dVar11,4.0);
              pKVar3->sum_four = dVar11 + pKVar3->sum_four;
            }
            uVar7 = uVar7 + 1;
            uVar4 = uVar9;
          } while (uVar9 - uVar8 != uVar7);
        }
      }
      uVar8 = uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}